

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3CheckObjectName(Parse *pParse,char *zName,char *zType,char *zTblName)

{
  byte bVar1;
  sqlite3 *db;
  char **ppcVar2;
  char *pcVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  uchar uVar7;
  uchar uVar8;
  
  db = pParse->db;
  uVar4 = (uint)db->flags;
  iVar5 = 0;
  if ((((uVar4 & 0x10000001) != 1) && (iVar5 = 0, ((db->init).field_0x6 & 2) == 0)) &&
     (sqlite3Config.bExtraSchemaChecks != '\0')) {
    if ((db->init).busy == '\0') {
      if ((zName == (char *)0x0) || (pParse->nested != '\0')) {
LAB_0017f483:
        if ((uVar4 >> 0x1c & 1) == 0) {
          return 0;
        }
        if (db->pVtabCtx != (VtabCtx *)0x0) {
          return 0;
        }
        if (db->nVdbeExec != 0) {
          return 0;
        }
        if ((0 < db->nVTrans) && (db->aVTrans == (VTable **)0x0)) {
          return 0;
        }
        iVar5 = sqlite3ShadowTableName(db,zName);
        if (iVar5 == 0) {
          return 0;
        }
      }
      else {
        lVar6 = 0;
        do {
          if ((ulong)(byte)zName[lVar6] == 0) {
            uVar8 = ""[(byte)"sqlite_"[lVar6]];
            uVar7 = '\0';
LAB_0017f464:
            if (uVar7 != uVar8) goto LAB_0017f483;
            break;
          }
          uVar7 = ""[(byte)zName[lVar6]];
          uVar8 = ""[(byte)"sqlite_"[lVar6]];
          if (uVar7 != uVar8) goto LAB_0017f464;
          lVar6 = lVar6 + 1;
        } while (lVar6 != 7);
      }
      sqlite3ErrorMsg(pParse,"object name reserved for internal use: %s",zName);
    }
    else {
      ppcVar2 = (db->init).azInit;
      pcVar3 = *ppcVar2;
      if (zType == (char *)0x0) {
        if (pcVar3 == (char *)0x0) {
LAB_0017f3ea:
          pcVar3 = ppcVar2[1];
          if (zName == (char *)0x0) {
            if (pcVar3 == (char *)0x0) {
LAB_0017f42b:
              iVar5 = sqlite3_stricmp(zTblName,ppcVar2[2]);
              if (iVar5 == 0) {
                return 0;
              }
            }
          }
          else if (pcVar3 != (char *)0x0) {
            lVar6 = 0;
            do {
              bVar1 = zName[lVar6];
              if (bVar1 == pcVar3[lVar6]) {
                if ((ulong)bVar1 == 0) goto LAB_0017f42b;
              }
              else if (""[bVar1] != ""[(byte)pcVar3[lVar6]]) break;
              lVar6 = lVar6 + 1;
            } while( true );
          }
        }
      }
      else if (pcVar3 != (char *)0x0) {
        lVar6 = 0;
        do {
          bVar1 = zType[lVar6];
          if (bVar1 == pcVar3[lVar6]) {
            if ((ulong)bVar1 == 0) goto LAB_0017f3ea;
          }
          else if (""[bVar1] != ""[(byte)pcVar3[lVar6]]) break;
          lVar6 = lVar6 + 1;
        } while( true );
      }
      sqlite3ErrorMsg(pParse,"");
    }
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

SQLITE_PRIVATE int sqlite3CheckObjectName(
  Parse *pParse,            /* Parsing context */
  const char *zName,        /* Name of the object to check */
  const char *zType,        /* Type of this object */
  const char *zTblName      /* Parent table name for triggers and indexes */
){
  sqlite3 *db = pParse->db;
  if( sqlite3WritableSchema(db)
   || db->init.imposterTable
   || !sqlite3Config.bExtraSchemaChecks
  ){
    /* Skip these error checks for writable_schema=ON */
    return SQLITE_OK;
  }
  if( db->init.busy ){
    if( sqlite3_stricmp(zType, db->init.azInit[0])
     || sqlite3_stricmp(zName, db->init.azInit[1])
     || sqlite3_stricmp(zTblName, db->init.azInit[2])
    ){
      sqlite3ErrorMsg(pParse, ""); /* corruptSchema() will supply the error */
      return SQLITE_ERROR;
    }
  }else{
    if( (pParse->nested==0 && 0==sqlite3StrNICmp(zName, "sqlite_", 7))
     || (sqlite3ReadOnlyShadowTables(db) && sqlite3ShadowTableName(db, zName))
    ){
      sqlite3ErrorMsg(pParse, "object name reserved for internal use: %s",
                      zName);
      return SQLITE_ERROR;
    }

  }
  return SQLITE_OK;
}